

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::~UKF(UKF *this)

{
  UKF *this_local;
  
  this->_vptr_UKF = (_func_int **)&PTR__UKF_00169d38;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->weights_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->Xsig_pred_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->x_);
  return;
}

Assistant:

UKF::~UKF() {}